

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

void __thiscall TString::ToUpperCase(TString *this)

{
  int i;
  TString *this_local;
  
  for (i = 0; this->myString[i] != '\0'; i = i + 1) {
    if (('`' < this->myString[i]) && (this->myString[i] < '{')) {
      this->myString[i] = this->myString[i] + -0x20;
    }
  }
  return;
}

Assistant:

void TString::ToUpperCase(void)
{
	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'a' && *(myString + i) <= 'z')
			*(myString + i) += 'A' - 'a';
}